

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodea.c
# Opt level: O1

int CVodeQuadInitB(void *cvode_mem,int which,CVQuadRhsFnB fQB,N_Vector yQB0)

{
  int iVar1;
  int iVar2;
  int error_code;
  char *msgfmt;
  int *piVar3;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    iVar2 = -0x15;
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
    iVar1 = 0x437;
  }
  else if (*(int *)((long)cvode_mem + 0xa78) == 0) {
    msgfmt = "Illegal attempt to call before calling CVodeAdjMalloc.";
    iVar2 = -0x65;
    error_code = -0x65;
    iVar1 = 0x441;
  }
  else {
    if (which < *(int *)(*(long *)((long)cvode_mem + 0xa70) + 0x38)) {
      for (piVar3 = *(int **)(*(long *)((long)cvode_mem + 0xa70) + 0x30);
          (piVar3 != (int *)0x0 && (*piVar3 != which)); piVar3 = *(int **)(piVar3 + 0x1e)) {
      }
      iVar1 = CVodeQuadInit(*(void **)(piVar3 + 4),CVArhsQ,yQB0);
      if (iVar1 != 0) {
        return iVar1;
      }
      piVar3[7] = 0;
      *(CVQuadRhsFnB *)(piVar3 + 0xc) = fQB;
      return 0;
    }
    msgfmt = "Illegal value for which.";
    iVar2 = -0x16;
    error_code = -0x16;
    iVar1 = 0x44a;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,iVar1,"CVodeQuadInitB",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodea.c"
                 ,msgfmt);
  return iVar2;
}

Assistant:

int CVodeQuadInitB(void* cvode_mem, int which, CVQuadRhsFnB fQB, N_Vector yQB0)
{
  CVodeMem cv_mem;
  CVadjMem ca_mem;
  CVodeBMem cvB_mem;
  void* cvodeB_mem;
  int flag;

  /* Check if cvode_mem exists */
  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(CV_PROFILER);

  /* Was ASA initialized? */
  if (cv_mem->cv_adjMallocDone == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_ADJ, __LINE__, __func__, __FILE__, MSGCV_NO_ADJ);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_NO_ADJ);
  }
  ca_mem = cv_mem->cv_adj_mem;

  /* Check which */
  if (which >= ca_mem->ca_nbckpbs)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_WHICH);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_ILL_INPUT);
  }

  /* Find the CVodeBMem entry in the linked list corresponding to which */
  cvB_mem = ca_mem->cvB_mem;
  while (cvB_mem != NULL)
  {
    if (which == cvB_mem->cv_index) { break; }
    cvB_mem = cvB_mem->cv_next;
  }

  cvodeB_mem = (void*)(cvB_mem->cv_mem);

  flag = CVodeQuadInit(cvodeB_mem, CVArhsQ, yQB0);
  if (flag != CV_SUCCESS)
  {
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (flag);
  }

  cvB_mem->cv_fQ_withSensi = SUNFALSE;
  cvB_mem->cv_fQ           = fQB;

  SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
  return (CV_SUCCESS);
}